

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnHeader
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,NLHeader *h)

{
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  
  BasicProblem<mp::BasicProblemParams<int>_>::SetInfo(this->builder_,&h->super_NLProblemInfo);
  AddVariables(this,h);
  iVar3 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs;
  if (iVar3 != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs(this->builder_,iVar3);
  }
  uVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_objs;
  iVar3 = (*this->_vptr_NLProblemBuilder[3])(this);
  if ((char)iVar3 == '\0') {
    iVar3 = (*this->_vptr_NLProblemBuilder[2])(this);
    uVar2 = (uint)(0 < (int)uVar2 && 0 < iVar3);
  }
  if (uVar2 != 0) {
    pBVar1 = this->builder_;
    std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::resize
              (&pBVar1->linear_objs_,(long)(int)uVar2);
    std::vector<bool,_std::allocator<bool>_>::resize(&pBVar1->is_obj_max_,(long)(int)uVar2,false);
  }
  sVar4 = (size_type)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons;
  if (sVar4 != 0) {
    std::
    vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
    ::resize(&this->builder_->algebraic_cons_,sVar4);
  }
  sVar4 = (size_type)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons;
  if (sVar4 != 0) {
    std::
    vector<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
    ::resize(&this->builder_->logical_cons_,sVar4);
  }
  iVar3 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs;
  if (iVar3 != 0) {
    BasicExprFactory<std::allocator<char>_>::AddFunctions(&this->builder_->super_ExprFactory,iVar3);
    return;
  }
  return;
}

Assistant:

void OnHeader(const NLHeader &h) {
    builder_.SetInfo(h);

    // As nl-benchmark shows, adding problem components at once and then
    // updating them is faster than adding them incrementally. The latter
    // requires additional checks to make sure that problem components are
    // in the correct order.
    AddVariables(h);
    if (int n = h.num_common_exprs())
      builder_.AddCommonExprs(n);
    int n_objs = resulting_nobj( h.num_objs );
    if (n_objs != 0)
      builder_.AddObjs( n_objs );
    if (h.num_algebraic_cons != 0)
      builder_.AddAlgebraicCons(h.num_algebraic_cons);
    if (h.num_logical_cons != 0)
      builder_.AddLogicalCons(h.num_logical_cons);
    if (h.num_funcs != 0)
      builder_.AddFunctions(h.num_funcs);
  }